

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# divceil.hpp
# Opt level: O0

enable_if_t<std::is_signed<short>::value_&&_(std::is_signed<unsigned_short>::value____(std::is_unsigned<unsigned_short>::value_&&_std::is_signed<std::common_type_t<short,_unsigned_short>_>::value)),_short>
 burst::divceil<short,unsigned_short>(Integer<short> n,Integer<unsigned_short> divisor)

{
  enable_if_t<std::is_signed<short>::value_&&_(std::is_signed<unsigned_short>::value____(std::is_unsigned<unsigned_short>::value_&&_std::is_signed<std::common_type_t<short,_unsigned_short>_>::value)),_short>
  eVar1;
  domain_error *this;
  Integer<unsigned_short> divisor_local;
  Integer<short> n_local;
  
  if (divisor != 0) {
    eVar1 = detail::divceil_impl<short,unsigned_short>(n,divisor);
    return eVar1;
  }
  this = (domain_error *)__cxa_allocate_exception(0x10);
  std::domain_error::domain_error(this,anon_var_dwarf_1eced);
  __cxa_throw(this,&std::domain_error::typeinfo,std::domain_error::~domain_error);
}

Assistant:

constexpr auto divceil (Integer<I> n, Integer<J> divisor)
    {
        if (divisor > 0)
        {
            return detail::divceil_impl(n, divisor);
        }
        else
        {
            throw std::domain_error("Целая часть от деления на неположительное число не определена.");
        }
    }